

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O2

void multiply(features *f_dest,features *f_src2,interact *in)

{
  vw *pvVar1;
  ulong uVar2;
  ulong i;
  ulong uVar3;
  float *pfVar4;
  float *pfVar5;
  ulong i_00;
  uint64_t *puVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  features::clear(f_dest);
  pvVar1 = in->all;
  puVar6 = &(pvVar1->weights).dense_weights._weight_mask;
  if ((pvVar1->weights).sparse != false) {
    puVar6 = &(pvVar1->weights).sparse_weights._weight_mask;
  }
  uVar2 = *puVar6;
  i = *(in->feat_store).indicies._begin;
  uVar3 = *(f_src2->indicies)._begin;
  features::push_back(f_dest,*(in->feat_store).values._begin * *(f_src2->values)._begin,i);
  uVar8 = 1;
  uVar12 = 0;
  uVar10 = 0;
  uVar13 = uVar8;
  do {
    pfVar4 = (in->feat_store).values._begin;
    pfVar5 = (f_src2->values)._begin;
    uVar9 = uVar10;
    uVar11 = uVar12;
    while( true ) {
      if (((ulong)((long)(in->feat_store).values._end - (long)pfVar4 >> 2) <= uVar13) ||
         ((ulong)((long)(f_src2->values)._end - (long)pfVar5 >> 2) <= uVar8)) {
        return;
      }
      i_00 = (in->feat_store).indicies._begin[uVar13];
      uVar10 = (i_00 & uVar2) - (i & uVar2) & uVar2;
      if ((uVar10 < uVar9) ||
         (uVar12 = ((f_src2->indicies)._begin[uVar8] & uVar2) - (uVar3 & uVar2) & uVar2,
         uVar12 < uVar11)) {
        poVar7 = std::operator<<((ostream *)&std::cout,"interact features are out of order: ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7," < ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7,". Skipping features.");
        std::endl<char,std::char_traits<char>>(poVar7);
        return;
      }
      if (uVar10 == uVar12) break;
      if (uVar10 < uVar12) goto LAB_001ef33a;
      uVar8 = uVar8 + 1;
      uVar9 = uVar10;
      uVar11 = uVar12;
    }
    features::push_back(f_dest,pfVar4[uVar13] * pfVar5[uVar8],i_00);
    uVar8 = uVar8 + 1;
LAB_001ef33a:
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void multiply(features& f_dest, features& f_src2, interact& in)
{
  f_dest.clear();
  features& f_src1 = in.feat_store;
  vw* all = in.all;
  uint64_t weight_mask = all->weights.mask();
  uint64_t base_id1 = f_src1.indicies[0] & weight_mask;
  uint64_t base_id2 = f_src2.indicies[0] & weight_mask;

  f_dest.push_back(f_src1.values[0] * f_src2.values[0], f_src1.indicies[0]);

  uint64_t prev_id1 = 0;
  uint64_t prev_id2 = 0;

  for (size_t i1 = 1, i2 = 1; i1 < f_src1.size() && i2 < f_src2.size();)
  {
    // calculating the relative offset from the namespace offset used to match features
    uint64_t cur_id1 = (uint64_t)(((f_src1.indicies[i1] & weight_mask) - base_id1) & weight_mask);
    uint64_t cur_id2 = (uint64_t)(((f_src2.indicies[i2] & weight_mask) - base_id2) & weight_mask);

    // checking for sorting requirement
    if (cur_id1 < prev_id1)
    {
      cout << "interact features are out of order: " << cur_id1 << " < " << prev_id1 << ". Skipping features." << endl;
      return;
    }

    if (cur_id2 < prev_id2)
    {
      cout << "interact features are out of order: " << cur_id2 << " < " << prev_id2 << ". Skipping features." << endl;
      return;
    }

    if (cur_id1 == cur_id2)
    {
      f_dest.push_back(f_src1.values[i1] * f_src2.values[i2], f_src1.indicies[i1]);
      i1++;
      i2++;
    }
    else if (cur_id1 < cur_id2)
      i1++;
    else
      i2++;
    prev_id1 = cur_id1;
    prev_id2 = cur_id2;
  }
}